

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O3

void __thiscall
Molecules::AddTriple(Molecules *this,KEY_ID s,KEY_ID p,KEY_ID o,KEY_ID prov,unsigned_short scope)

{
  size_t *this_00;
  _Rb_tree_color _type;
  TYPE_ID TVar1;
  TYPE_ID o_00;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_01;
  iterator iVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  _Base_ptr p_Var5;
  _Self __tmp_1;
  long lVar6;
  pair<const_unsigned_long,_Molecule> **__v;
  long lVar7;
  _Self __tmp;
  bool bVar8;
  pair<unsigned_long,_std::set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>_>
  local_118;
  undefined1 local_e0 [8];
  multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  tripleTmpls;
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  tt;
  long local_70;
  ulong local_58;
  pair<const_unsigned_long,_Molecule> **pppStack_48;
  vector<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  elems;
  
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tripleTmpls;
  tripleTmpls._M_t._M_impl._0_4_ = 0;
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  tt._M_t._M_impl.super__Rb_tree_header._M_node_count = prov;
  TVar1 = KeyManager::GetType(s);
  o_00 = KeyManager::GetType(o);
  TemplateManager::GetTemplates
            ((TemplateManager *)diplo::TM,TVar1,p,o_00,scope,
             (multimap<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              *)local_e0);
  if (diplo::M._16_8_ != 0) {
    lVar7 = 0x142cd0;
    lVar4 = diplo::M._16_8_;
    do {
      bVar8 = *(ulong *)(lVar4 + 0x20) < s;
      if (!bVar8) {
        lVar7 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar8 * 8);
    } while (lVar4 != 0);
    local_70 = 0x142cd0;
    if ((lVar7 != 0x142cd0) && (*(ulong *)(lVar7 + 0x20) <= s)) {
      pppStack_48 = (pair<const_unsigned_long,_Molecule> **)0x0;
      elems.
      super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      elems.
      super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
        TVar1 = KeyManager::GetType(s);
        TypesManager::AddElement((TypesManager *)diplo::TypesM,TVar1,s);
        TVar1 = KeyManager::GetType(o);
        TypesManager::AddElement((TypesManager *)diplo::TypesM,TVar1,o);
        if (tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Base_ptr)&tripleTmpls) {
          local_58 = 0xffffffffffffffff;
          p_Var5 = tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            _type = p_Var5[1]._M_color;
            __v = pppStack_48;
            if (local_58 != _type) {
              this_01 = &TypesManager::GetElementsOfType((TypesManager *)diplo::TypesM,_type)->_M_h;
              if (elems.
                  super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != pppStack_48) {
                elems.
                super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                ._M_impl.super__Vector_impl_data._M_start = pppStack_48;
              }
              p_Var3 = *(_Rb_tree_node_base **)(lVar7 + 0x40);
              __v = pppStack_48;
              while (pppStack_48 = __v, local_58 = (ulong)_type,
                    p_Var3 != (_Rb_tree_node_base *)(lVar7 + 0x30)) {
                iVar2 = std::
                        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(this_01,*(key_type **)(p_Var3 + 1));
                if (iVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur !=
                    (__node_type *)0x0) {
                  if (elems.
                      super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      elems.
                      super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    std::
                    vector<std::pair<unsigned_long_const,Molecule>*,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
                    ::_M_realloc_insert<std::pair<unsigned_long_const,Molecule>*const&>
                              ((vector<std::pair<unsigned_long_const,Molecule>*,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
                                *)&pppStack_48,
                               (iterator)
                               elems.
                               super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (pair<const_unsigned_long,_Molecule> **)(p_Var3 + 1));
                  }
                  else {
                    *elems.
                     super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start =
                         *(pair<const_unsigned_long,_Molecule> **)(p_Var3 + 1);
                    elems.
                    super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         elems.
                         super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1;
                  }
                }
                p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
                __v = pppStack_48;
              }
            }
            for (; __v != elems.
                          super__Vector_base<std::pair<const_unsigned_long,_Molecule>_*,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; __v = __v + 1) {
              Molecule::FindEntityAndAddNext
                        (&(*__v)->second,(size_t)p_Var5[1]._M_parent,o,s,
                         tt._M_t._M_impl.super__Rb_tree_header._M_node_count,scope);
              lVar4 = diplo::M._16_8_;
              lVar6 = local_70;
              if (diplo::M._16_8_ == 0) {
LAB_0012ea15:
                tt._M_t._M_impl._0_4_ = 0;
                tt._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                tt._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                tt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tt;
                tt._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
                this_00 = &tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_node_count;
                tt._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     tt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                std::
                _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
                ::_M_insert_unique<std::pair<unsigned_long_const,Molecule>*const&>
                          ((_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
                            *)this_00,__v);
                local_118.first = o;
                std::
                _Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                ::_Rb_tree(&local_118.second._M_t,
                           (_Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                            *)this_00);
                std::
                _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>>
                ::
                _M_emplace_unique<std::pair<unsigned_long,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>
                          ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::set<std::pair<unsigned_long_const,Molecule>*,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>>>>
                            *)this,&local_118);
                std::
                _Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                ::~_Rb_tree(&local_118.second._M_t);
                std::
                _Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                ::~_Rb_tree((_Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
                             *)&tripleTmpls._M_t._M_impl.super__Rb_tree_header._M_node_count);
              }
              else {
                do {
                  bVar8 = *(ulong *)(lVar4 + 0x20) < o;
                  if (!bVar8) {
                    lVar6 = lVar4;
                  }
                  lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar8 * 8);
                } while (lVar4 != 0);
                if ((lVar6 == 0x142cd0) || (o < *(ulong *)(lVar6 + 0x20))) goto LAB_0012ea15;
                std::
                _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
                ::_M_insert_unique<std::pair<unsigned_long_const,Molecule>*const&>
                          ((_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
                            *)(lVar6 + 0x28),__v);
              }
            }
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          } while (p_Var5 != (_Rb_tree_node_base *)&tripleTmpls);
        }
        if (pppStack_48 != (pair<const_unsigned_long,_Molecule> **)0x0) {
          operator_delete(pppStack_48);
        }
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               *)local_e0);
  return;
}

Assistant:

void Molecules::AddTriple(KEY_ID s, KEY_ID p, KEY_ID o, KEY_ID prov, unsigned short int scope) {
	multimap<TYPE_ID, size_t> tripleTmpls;
	diplo::TM.GetTemplates(diplo::KM.GetType(s), p, diplo::KM.GetType(o), scope, &tripleTmpls);


	vector<KEY_ID> molecules_to_search_in;

	map <KEY_ID, set< pair<const KEY_ID, Molecule>* > >::iterator it_inv_molecules = diplo::M.inv_molecules.find(s);
	set< pair<const KEY_ID, Molecule>*  > * molecules_where_S_exists;

	if (it_inv_molecules != diplo::M.inv_molecules.end() ) {
		molecules_where_S_exists = &(it_inv_molecules->second);
	} else return; //this subject DOES NOT exist as an object in any triple


	vector< pair<const KEY_ID, Molecule>*  > elems;
	if (tripleTmpls.size() > 0) {

		diplo::TypesM.AddElement(KeyManager::GetType( s ), s );
		diplo::TypesM.AddElement(KeyManager::GetType( o ), o );

		unordered_set< KEY_ID > * el;
		size_t t = -1;

		for (multimap<TYPE_ID, size_t>::iterator it = tripleTmpls.begin(); it !=  tripleTmpls.end(); it ++) { //scan all templates where TRIPLE can exist

			if (t != (size_t)it->first) {
				t = it->first;
				el = diplo::TypesM.GetElementsOfType( t  ); // get list of molecules where triple can be in contexst of the above template
				elems.clear();

				for (set < pair<const KEY_ID, Molecule>* >::iterator it2 = molecules_where_S_exists->begin(); it2 != molecules_where_S_exists->end(); it2++) {
					//check if in the molecule SUBJECT exists as an OBJECT, if YES, that is what we want!!
					if ( el->find( (*it2)->first ) != el->end() ) {
						elems.push_back( *it2 );
					}
				}





			}



			for (vector< pair<const KEY_ID, Molecule>*  >::iterator it2 = elems.begin(); it2 != elems.end(); it2++) {

				(*it2)->second.FindEntityAndAddNext(it->second, o, s, prov, scope); //it has to be added there, molecules are preselected so it is just a question of finding right place to insert the triple
				//so then we can add also to the inverted index, that THE OBJECT (o) in THE MOLECULE pointer by *it2
				map <KEY_ID, set< pair<const KEY_ID, Molecule>* > >::iterator it_inv_molecules = diplo::M.inv_molecules.find(o);

				if (it_inv_molecules == diplo::M.inv_molecules.end() ) {
					set< pair<const KEY_ID, Molecule>* > tt;
					tt.insert( *it2 ) ;
					inv_molecules.insert( pair<KEY_ID, set< pair<const KEY_ID, Molecule>* > > (o, tt ) );
				} else {
					it_inv_molecules->second.insert( *it2 ) ;
				}


			}



		}
	}
}